

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int VP8LBitWriterClone(VP8LBitWriter *src,VP8LBitWriter *dst)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  size_t unaff_retaddr;
  size_t current_size;
  uint local_4;
  
  lVar1 = in_RDI[3];
  lVar2 = in_RDI[2];
  iVar3 = VP8LBitWriterResize((VP8LBitWriter *)current_size,unaff_retaddr);
  if (iVar3 != 0) {
    memcpy((void *)in_RSI[2],(void *)in_RDI[2],lVar1 - lVar2);
    *in_RSI = *in_RDI;
    *(undefined4 *)(in_RSI + 1) = *(undefined4 *)(in_RDI + 1);
    *(undefined4 *)(in_RSI + 5) = *(undefined4 *)(in_RDI + 5);
    in_RSI[3] = in_RSI[2] + (lVar1 - lVar2);
  }
  local_4 = (uint)(iVar3 != 0);
  return local_4;
}

Assistant:

int VP8LBitWriterClone(const VP8LBitWriter* const src,
                       VP8LBitWriter* const dst) {
  const size_t current_size = src->cur_ - src->buf_;
  assert(src->cur_ >= src->buf_ && src->cur_ <= src->end_);
  if (!VP8LBitWriterResize(dst, current_size)) return 0;
  memcpy(dst->buf_, src->buf_, current_size);
  dst->bits_ = src->bits_;
  dst->used_ = src->used_;
  dst->error_ = src->error_;
  dst->cur_ = dst->buf_ + current_size;
  return 1;
}